

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

vec3 vera::hue2rgb(float _hue)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar4 [16];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vec3 vVar9;
  
  fVar1 = _hue * 6.0;
  fVar2 = fmodf(fVar1,6.0);
  fVar3 = fmodf(fVar1 + 4.0,6.0);
  auVar7._0_4_ = ABS(fVar2 + -3.0) + -1.0;
  auVar7._4_4_ = ABS(fVar3 + -3.0) + -1.0;
  auVar7._8_4_ = ABS(extraout_XMM0_Db + 0.0) + 0.0;
  auVar7._12_4_ = ABS(extraout_XMM0_Db_00 + 0.0) + 0.0;
  auVar6 = minps(_DAT_002cf430,auVar7);
  auVar4._0_4_ = (uint)DAT_002cf430 & -(uint)NAN(auVar7._0_4_);
  auVar4._4_4_ = DAT_002cf430._4_4_ & -(uint)NAN(auVar7._4_4_);
  auVar4._8_4_ = DAT_002cf430._8_4_ & -(uint)NAN(auVar7._8_4_);
  auVar4._12_4_ = DAT_002cf430._12_4_ & -(uint)NAN(auVar7._12_4_);
  auVar8._0_4_ = ~-(uint)NAN(auVar7._0_4_) & auVar6._0_4_;
  auVar8._4_4_ = ~-(uint)NAN(auVar7._4_4_) & auVar6._4_4_;
  auVar8._8_4_ = ~-(uint)NAN(auVar7._8_4_) & auVar6._8_4_;
  auVar8._12_4_ = ~-(uint)NAN(auVar7._12_4_) & auVar6._12_4_;
  auVar8 = auVar8 | auVar4;
  auVar4 = maxps(ZEXT816(0),auVar8);
  fVar1 = fmodf(fVar1 + 2.0,6.0);
  aVar5.z = ABS(fVar1 + -3.0) + -1.0;
  if (1.0 <= aVar5.z) {
    aVar5.z = 1.0;
  }
  if (aVar5.z <= 0.0) {
    aVar5.z = 0.0;
  }
  vVar9.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (-(uint)(!NAN(auVar8._4_4_) && !NAN(auVar8._4_4_)) & auVar4._4_4_);
  vVar9.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
       (-(uint)(!NAN(auVar8._0_4_) && !NAN(auVar8._0_4_)) & auVar4._0_4_);
  vVar9.field_2.z = aVar5.z;
  return vVar9;
}

Assistant:

glm::vec3 hue2rgb(float _hue) {
    float r = saturate( abs( fmod( _hue * 6.f, 6.f) - 3.f) - 1.f );
    float g = saturate( abs( fmod( _hue * 6.f + 4.f, 6.f) - 3.f) - 1.f );
    float b = saturate( abs( fmod( _hue * 6.f + 2.f, 6.f) - 3.f) - 1.f );

    #ifdef HSV2RGB_SMOOTH
    r = r*r*(3. - 2. * r);
    g = g*g*(3. - 2. * g);
    b = b*b*(3. - 2. * b);
    #endif

    return glm::vec3(r, g, b);
}